

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioButton.cpp
# Opt level: O3

void __thiscall gui::RadioButton::setChecked(RadioButton *this,bool checked)

{
  pointer psVar1;
  element_type *peVar2;
  Container *pCVar3;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *pvVar4;
  RadioButton *pRVar5;
  shared_ptr<gui::Widget> *child;
  pointer psVar6;
  
  if (this->isChecked_ != checked) {
    this->isChecked_ = checked;
    Widget::requestRedraw((Widget *)this);
  }
  if ((checked) && (pCVar3 = Widget::getParent((Widget *)this), pCVar3 != (Container *)0x0)) {
    pCVar3 = Widget::getParent((Widget *)this);
    pvVar4 = ContainerBase::getChildren(&pCVar3->super_ContainerBase);
    psVar1 = (pvVar4->
             super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar6 = (pvVar4->
                  super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1)
    {
      peVar2 = (psVar6->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((((peVar2 != (element_type *)0x0) &&
           (pRVar5 = (RadioButton *)__dynamic_cast(peVar2,&Widget::typeinfo,&typeinfo,0),
           pRVar5 != (RadioButton *)0x0)) && (pRVar5 != this)) && (pRVar5->isChecked_ != false)) {
        pRVar5->isChecked_ = false;
        Widget::requestRedraw((Widget *)this);
      }
    }
  }
  return;
}

Assistant:

void RadioButton::setChecked(bool checked) {
    if (isChecked_ != checked) {
        isChecked_ = checked;
        requestRedraw();
    }

    if (!checked || getParent() == nullptr) {
        return;
    }
    for (const auto& child : getParent()->getChildren()) {
        auto childButton = dynamic_cast<RadioButton*>(child.get());
        if (childButton != nullptr && childButton->isChecked_ && childButton != this) {
            childButton->isChecked_ = false;
            requestRedraw();
        }
    }
}